

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

void udp_ep_connect(void *arg,nni_aio *aio)

{
  nni_mtx *mtx;
  _Bool _Var1;
  int iVar2;
  nng_err result;
  
  mtx = (nni_mtx *)((long)arg + 8);
  nni_mtx_lock(mtx);
  _Var1 = nni_aio_start(aio,udp_ep_cancel,arg);
  if (!_Var1) {
LAB_001261d7:
    nni_mtx_unlock(mtx);
    return;
  }
  if (*(char *)((long)arg + 0x36) == '\x01') {
    nni_mtx_unlock(mtx);
    result = NNG_ECLOSED;
  }
  else {
    if (*(char *)((long)arg + 0x35) != '\x01') {
      iVar2 = nni_list_empty((nni_list *)((long)arg + 0x9f0));
      if (iVar2 == 0) {
        nni_panic("%s: %d: assert err: %s",
                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/udp/udp.c"
                  ,0x5fa,"nni_list_empty(&ep->connaios)");
      }
      *(undefined1 *)((long)arg + 1000) = 1;
      nni_list_append((nni_list *)((long)arg + 0x9f0),aio);
      *(undefined8 *)((long)arg + 0xa58) = 0;
      *(undefined8 *)((long)arg + 0xa60) = 0;
      *(undefined8 *)((long)arg + 0xa68) = 0;
      *(undefined8 *)((long)arg + 0xa70) = 0;
      *(uint *)((long)arg + 0xa58) = (uint)*(ushort *)((long)arg + 0x32);
      *(undefined8 *)((long)arg + 0xa60) = *(undefined8 *)(*(long *)((long)arg + 0x38) + 0x10);
      *(undefined2 *)((long)arg + 0xa68) = *(undefined2 *)(*(long *)((long)arg + 0x38) + 0x18);
      *(undefined1 *)((long)arg + 0xa5c) = 0;
      *(long *)((long)arg + 0xa70) = (long)arg + 0x8e0;
      nni_aio_set_timeout((nni_aio *)((long)arg + 0x220),5000);
      nni_resolv((nni_resolv_item *)((long)arg + 0xa58),(nni_aio *)((long)arg + 0x220));
      nni_aio_abort((nni_aio *)((long)arg + 0x58),NNG_EINTR);
      goto LAB_001261d7;
    }
    nni_mtx_unlock(mtx);
    result = NNG_EBUSY;
  }
  nni_aio_finish_error(aio,result);
  return;
}

Assistant:

static void
udp_ep_connect(void *arg, nni_aio *aio)
{
	udp_ep *ep = arg;

	nni_mtx_lock(&ep->mtx);
	if (!nni_aio_start(aio, udp_ep_cancel, ep)) {
		nni_mtx_unlock(&ep->mtx);
		return;
	}
	if (ep->closed) {
		nni_mtx_unlock(&ep->mtx);
		nni_aio_finish_error(aio, NNG_ECLOSED);
		return;
	}
	if (ep->started) {
		nni_mtx_unlock(&ep->mtx);
		nni_aio_finish_error(aio, NNG_EBUSY);
		return;
	}
	NNI_ASSERT(nni_list_empty(&ep->connaios));
	ep->dialer = true;

	nni_list_append(&ep->connaios, aio);

	// lookup the IP address

	memset(&ep->resolv, 0, sizeof(ep->resolv));
	ep->resolv.ri_family  = ep->af;
	ep->resolv.ri_host    = ep->url->u_hostname;
	ep->resolv.ri_port    = ep->url->u_port;
	ep->resolv.ri_passive = false;
	ep->resolv.ri_sa      = &ep->peer_sa;
	nni_aio_set_timeout(&ep->resaio, NNI_SECOND * 5);
	nni_resolv(&ep->resolv, &ep->resaio);

	// wake up for retries
	nni_aio_abort(&ep->timeaio, NNG_EINTR);

	nni_mtx_unlock(&ep->mtx);
}